

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cc
# Opt level: O0

uchar * SHA384(uchar *d,size_t n,uchar *md)

{
  undefined1 local_f8 [8];
  SHA512_CTX ctx;
  uint8_t *out_local;
  size_t len_local;
  uint8_t *data_local;
  
  ctx._208_8_ = md;
  BCM_sha384_init((SHA512_CTX *)local_f8);
  BCM_sha384_update((SHA512_CTX *)local_f8,d,n);
  BCM_sha384_final((uint8_t *)ctx._208_8_,(SHA512_CTX *)local_f8);
  OPENSSL_cleanse(local_f8,0xd8);
  return (uchar *)ctx._208_8_;
}

Assistant:

uint8_t *SHA384(const uint8_t *data, size_t len,
                uint8_t out[SHA384_DIGEST_LENGTH]) {
  SHA512_CTX ctx;
  BCM_sha384_init(&ctx);
  BCM_sha384_update(&ctx, data, len);
  BCM_sha384_final(out, &ctx);
  OPENSSL_cleanse(&ctx, sizeof(ctx));
  return out;
}